

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TheoryAxioms.cpp
# Opt level: O0

void __thiscall Shell::TheoryAxioms::addCommutativity(TheoryAxioms *this,Interpretation op)

{
  Term *in_RDI;
  uint in_stack_00000008;
  InferenceRule in_stack_0000000f;
  TheoryAxioms *in_stack_00000010;
  initializer_list<Kernel::Literal_*> in_stack_00000018;
  Literal *eq;
  TermList fyx;
  TermList fxy;
  TermList y;
  TermList x;
  TermList srt;
  uint f;
  Signature *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff80;
  uint fn;
  TermList in_stack_ffffffffffffff88;
  TermList in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffffbf;
  TermList in_stack_ffffffffffffffd0;
  undefined8 local_28;
  undefined8 local_20;
  
  fn = (uint)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  Kernel::Signature::getInterpretingSymbol
            (in_stack_ffffffffffffff70,(Interpretation)((ulong)in_RDI >> 0x20));
  Kernel::Theory::getOperationSort((Interpretation)((ulong)in_RDI >> 0x20));
  Kernel::TermList::TermList
            ((TermList *)in_stack_ffffffffffffff70,(uint)((ulong)in_RDI >> 0x20),
             SUB81((ulong)in_RDI >> 0x18,0));
  Kernel::TermList::TermList
            ((TermList *)in_stack_ffffffffffffff70,(uint)((ulong)in_RDI >> 0x20),
             SUB81((ulong)in_RDI >> 0x18,0));
  Kernel::Term::create2(fn,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Kernel::TermList::TermList((TermList *)in_stack_ffffffffffffff70,in_RDI);
  Kernel::Term::create2(fn,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Kernel::TermList::TermList((TermList *)in_stack_ffffffffffffff70,in_RDI);
  Kernel::Literal::createEquality
            ((bool)in_stack_ffffffffffffffbf,in_stack_ffffffffffffffd0,local_20,local_28);
  addTheoryClauseFromLits(in_stack_00000010,in_stack_00000018,in_stack_0000000f,in_stack_00000008);
  return;
}

Assistant:

void TheoryAxioms::addCommutativity(Interpretation op)
{
  ASS(theory->isFunction(op));
  ASS_EQ(theory->getArity(op),2);

  unsigned f = env.signature->getInterpretingSymbol(op);
  TermList srt = theory->getOperationSort(op);
  TermList x(0,false);
  TermList y(1,false);
  TermList fxy(Term::create2(f,x,y));
  TermList fyx(Term::create2(f,y,x));
  Literal* eq = Literal::createEquality(true,fxy,fyx,srt);
  addTheoryClauseFromLits({eq}, InferenceRule::THA_COMMUTATIVITY, EXPENSIVE);
}